

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O3

void movebubbles(void)

{
  obj *poVar1;
  monst *worm;
  bubble *pbVar2;
  xchar xVar3;
  byte *pbVar4;
  container *pcVar5;
  trap *ptVar6;
  ulong uVar7;
  uint uVar8;
  obj *poVar10;
  uint uVar11;
  xchar xVar12;
  uint uVar13;
  level *plVar14;
  obj *otmp;
  ulong uVar9;
  
  if (wportal == (trap *)0x0) {
    wportal = (trap *)&level->lev_traps;
    do {
      wportal = wportal->ntrap;
      if (wportal == (trap *)0x0) {
        wportal = (trap *)0x0;
        impossible("set_wportal(): no portal!");
        break;
      }
    } while ((wportal->field_0x8 & 0x1f) != 0x12);
  }
  vision_recalc(2);
  if (uball != (obj *)0x0) {
    unplacebc();
  }
  pbVar2 = bbubbles;
  if (bubble_up == '\0') {
    pbVar2 = ebubbles;
  }
  while( true ) {
    if (pbVar2 == (bubble *)0x0) {
      bubble_up = bubble_up == '\0';
      pbVar2 = ebubbles;
      if ((bool)bubble_up) {
        pbVar2 = bbubbles;
      }
      for (; pbVar2 != (bubble *)0x0; pbVar2 = (&pbVar2->prev)[bubble_up != '\0']) {
        uVar8 = mt_random();
        uVar11 = mt_random();
        uVar13 = (uint)(uVar8 % 3 != 0);
        if (pbVar2->dx == '\0') {
          uVar13 = uVar8 % 3;
        }
        uVar8 = (uint)(uVar11 % 3 != 0);
        if (pbVar2->dy == '\0') {
          uVar8 = uVar11 % 3;
        }
        mv_bubble(level,pbVar2,((int)pbVar2->dx - uVar13) + 1,((int)pbVar2->dy - uVar8) + 1,'\0');
      }
      if (uball != (obj *)0x0) {
        placebc();
      }
      vision_full_recalc = '\x01';
      return;
    }
    if (pbVar2->cons != (container *)0x0) break;
    pbVar4 = pbVar2->bm;
    uVar13 = (uint)*pbVar4;
    if (*pbVar4 != 0) {
      uVar8 = (uint)pbVar2->x;
      uVar11 = 0;
      do {
        uVar9 = (ulong)uVar8;
        if (pbVar4[1] != 0) {
          uVar13 = (uint)pbVar2->y;
          uVar7 = 0;
          do {
            if ((1 << ((byte)uVar11 & 0x1f) & (uint)pbVar4[uVar7 + 2]) != 0) {
              if (uVar8 - 1 < 0x4f && uVar13 < 0x15) {
                poVar1 = level->objects[uVar9][uVar13];
                xVar3 = (xchar)uVar8;
                xVar12 = (xchar)uVar13;
                plVar14 = level;
                if (poVar1 != (obj *)0x0) {
                  pcVar5 = (container *)malloc(0x18);
                  poVar10 = (obj *)0x0;
                  do {
                    otmp = poVar1;
                    remove_object(otmp);
                    otmp->ox = '\0';
                    otmp->oy = '\0';
                    (otmp->v).v_nexthere = poVar10;
                    plVar14 = level;
                    poVar1 = level->objects[uVar9][uVar13];
                    poVar10 = otmp;
                  } while (poVar1 != (obj *)0x0);
                  pcVar5->x = xVar3;
                  pcVar5->y = xVar12;
                  pcVar5->what = 0;
                  pcVar5->list = otmp;
                  pcVar5->next = pbVar2->cons;
                  pbVar2->cons = pcVar5;
                }
                worm = plVar14->monsters[uVar9][uVar13];
                if ((worm != (monst *)0x0) && ((worm->field_0x61 & 2) == 0)) {
                  pcVar5 = (container *)malloc(0x18);
                  pcVar5->x = xVar3;
                  pcVar5->y = xVar12;
                  pcVar5->what = 1;
                  pcVar5->list = worm;
                  pcVar5->next = pbVar2->cons;
                  pbVar2->cons = pcVar5;
                  if (worm->wormno == '\0') {
                    remove_monster(plVar14,uVar8,uVar13);
                  }
                  else {
                    remove_worm(worm);
                  }
                  newsym(uVar8,uVar13);
                  worm->mx = '\0';
                  worm->my = '\0';
                }
                if ((((u._1052_1_ & 1) == 0) && (uVar8 == (int)u.ux)) && (uVar13 == (int)u.uy)) {
                  pcVar5 = (container *)malloc(0x18);
                  pcVar5->x = xVar3;
                  pcVar5->y = xVar12;
                  pcVar5->what = 2;
                  pcVar5->list = (void *)0x0;
                  pcVar5->next = pbVar2->cons;
                  pbVar2->cons = pcVar5;
                }
                ptVar6 = t_at(level,uVar8,uVar13);
                if (ptVar6 != (trap *)0x0) {
                  pcVar5 = (container *)malloc(0x18);
                  pcVar5->x = xVar3;
                  pcVar5->y = xVar12;
                  pcVar5->what = 3;
                  pcVar5->list = ptVar6;
                  pcVar5->next = pbVar2->cons;
                  pbVar2->cons = pcVar5;
                }
                plVar14 = level;
                *(undefined8 *)(level->locations[uVar9] + uVar13) = 0x1300000014;
                *(undefined4 *)&plVar14->locations[uVar9][uVar13].field_0x8 = 0;
                block_point(uVar8,uVar13);
              }
              else {
                impossible("movebubbles: bad pos (%d,%d)",uVar9,(ulong)uVar13);
              }
            }
            uVar7 = uVar7 + 1;
            uVar13 = uVar13 + 1;
            pbVar4 = pbVar2->bm;
          } while (uVar7 < pbVar4[1]);
          uVar13 = (uint)*pbVar4;
        }
        uVar11 = uVar11 + 1;
        uVar8 = uVar8 + 1;
      } while (uVar11 < uVar13);
    }
    pbVar2 = (&pbVar2->prev)[bubble_up != '\0'];
  }
  panic("movebubbles: cons != null");
}

Assistant:

void movebubbles(void)
{
	struct bubble *b;
	int x, y, i, j;
	struct trap *btrap;
	static const struct rm water_pos = { S_water, 0, 0, 0, 0, 0,
		WATER /* typ */, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };

	/* set up the portal the first time bubbles are moved */
	if (!wportal) set_wportal(level);

	vision_recalc(2);
	/* keep attached ball&chain separate from bubble objects */
	if (Punished) unplacebc();

	/*
	 * Pick up everything inside of a bubble then fill all bubble
	 * locations.
	 */

	for (b = bubble_up ? bbubbles : ebubbles; b; b = bubble_up ? b->next : b->prev) {
	    if (b->cons) panic("movebubbles: cons != null");
	    for (i = 0, x = b->x; i < (int) b->bm[0]; i++, x++)
		for (j = 0, y = b->y; j < (int) b->bm[1]; j++, y++)
		    if (b->bm[j + 2] & (1 << i)) {
			if (!isok(x,y)) {
			    impossible("movebubbles: bad pos (%d,%d)", x,y);
			    continue;
			}

			/* pick up objects, monsters, hero, and traps */
			if (OBJ_AT(x, y)) {
			    struct obj *olist = NULL, *otmp;
			    struct container *cons =
				malloc(sizeof(struct container));

			    while ((otmp = level->objects[x][y]) != 0) {
				remove_object(otmp);
				otmp->ox = otmp->oy = 0;
				otmp->nexthere = olist;
				olist = otmp;
			    }

			    cons->x = x;
			    cons->y = y;
			    cons->what = CONS_OBJ;
			    cons->list = olist;
			    cons->next = b->cons;
			    b->cons = cons;
			}
			if (MON_AT(level, x,y)) {
			    struct monst *mon = m_at(level, x,y);
			    struct container *cons =
				malloc(sizeof(struct container));

			    cons->x = x;
			    cons->y = y;
			    cons->what = CONS_MON;
			    cons->list = mon;

			    cons->next = b->cons;
			    b->cons = cons;

			    if (mon->wormno)
				remove_worm(mon);
			    else
				remove_monster(level, x, y);

			    newsym(x,y);	/* clean up old position */
			    mon->mx = mon->my = 0;
			}
			if (!u.uswallow && x == u.ux && y == u.uy) {
			    struct container *cons =
				malloc(sizeof(struct container));

			    cons->x = x;
			    cons->y = y;
			    cons->what = CONS_HERO;
			    cons->list = NULL;

			    cons->next = b->cons;
			    b->cons = cons;
			}
			if ((btrap = t_at(level, x, y)) != 0) {
			    struct container *cons =
				malloc(sizeof(struct container));

			    cons->x = x;
			    cons->y = y;
			    cons->what = CONS_TRAP;
			    cons->list = btrap;

			    cons->next = b->cons;
			    b->cons = cons;
			}

			level->locations[x][y] = water_pos;
			block_point(x,y);
		    }
	}

	/*
	 * Every second time traverse down.  This is because otherwise
	 * all the junk that changes owners when bubbles overlap
	 * would eventually end up in the last bubble in the chain.
	 */

	bubble_up = !bubble_up;
	for (b = bubble_up ? bbubbles : ebubbles; b; b = bubble_up ? b->next : b->prev) {
		int rx = rn2(3), ry = rn2(3);

		mv_bubble(level, b, b->dx + 1 - (!b->dx ? rx : (rx ? 1 : 0)),
			    b->dy + 1 - (!b->dy ? ry : (ry ? 1 : 0)),
			    FALSE);
	}

	/* put attached ball&chain back */
	if (Punished) placebc();
	vision_full_recalc = 1;
}